

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_unsigned_int_with_null(void)

{
  undefined1 local_5f;
  undefined1 local_5e [19];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  uint input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcf9,"void assign_suite::assign_unsigned_int_with_null()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_48,null);
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcfb,"void assign_suite::assign_unsigned_int_with_null()",local_5e,&local_5f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void assign_unsigned_int_with_null()
{
    unsigned int input = 2;
    variable data(input);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
    data = null;
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
}